

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O3

void Abc_SclUndoRecentChanges(Abc_Ntk_t *pNtk,Vec_Int_t *vTrans)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  void **ppvVar5;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFaninNew;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  uVar1 = vTrans->nSize;
  if (0x55555554 < uVar1 * -0x55555555 + 0x2aaaaaaa) {
    __assert_fail("Vec_IntSize(vTrans) % 3 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                  ,0x2d3,"void Abc_SclUndoRecentChanges(Abc_Ntk_t *, Vec_Int_t *)");
  }
  if (2 < (int)uVar1) {
    uVar8 = (ulong)uVar1 / 3 + 1;
    lVar7 = ((ulong)uVar1 / 3) * 3;
    do {
      uVar1 = vTrans->nSize;
      if ((long)(int)uVar1 <= lVar7 + -3) goto LAB_00477c93;
      piVar4 = vTrans->pArray;
      iVar6 = piVar4[lVar7 + -3];
      if ((long)iVar6 < 0) {
LAB_00477c74:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar2 = pNtk->vObjs->nSize;
      if ((int)uVar2 <= iVar6) goto LAB_00477c74;
      if (uVar1 <= (int)lVar7 - 2U) {
LAB_00477c93:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar3 = piVar4[lVar7 + -2];
      if (((long)(int)uVar3 < 0) || (uVar2 <= uVar3)) goto LAB_00477c74;
      if (uVar1 <= (int)lVar7 - 1U) goto LAB_00477c93;
      uVar1 = piVar4[lVar7 + -1];
      if (((long)(int)uVar1 < 0) || (uVar2 <= uVar1)) goto LAB_00477c74;
      ppvVar5 = pNtk->vObjs->pArray;
      pObj = (Abc_Obj_t *)ppvVar5[iVar6];
      pFaninNew = (Abc_Obj_t *)ppvVar5[(int)uVar1];
      Abc_ObjPatchFanin(pObj,(Abc_Obj_t *)ppvVar5[(int)uVar3],pFaninNew);
      Abc_SclTimeIncUpdateLevel(pObj);
      if (pNtk->vPhases != (Vec_Int_t *)0x0) {
        iVar6 = Abc_SclIsInv(pFaninNew);
        if (iVar6 != 0) {
          Abc_NodeInvUpdateObjFanoutPolarity(pFaninNew,pObj);
        }
      }
      uVar8 = uVar8 - 1;
      lVar7 = lVar7 + -3;
    } while (1 < uVar8);
  }
  return;
}

Assistant:

void Abc_SclUndoRecentChanges( Abc_Ntk_t * pNtk, Vec_Int_t * vTrans )
{
    int i;
    assert( Vec_IntSize(vTrans) % 3 == 0 );
    for ( i = Vec_IntSize(vTrans)/3 - 1; i >= 0; i-- )
    {
        Abc_Obj_t * pFanout = Abc_NtkObj( pNtk, Vec_IntEntry(vTrans, 3*i+0) );
        Abc_Obj_t * pFanin  = Abc_NtkObj( pNtk, Vec_IntEntry(vTrans, 3*i+1) );
        Abc_Obj_t * pObj    = Abc_NtkObj( pNtk, Vec_IntEntry(vTrans, 3*i+2) );
        // we do not update load here because times will be recomputed
        Abc_ObjPatchFanin( pFanout, pFanin, pObj );
        Abc_SclTimeIncUpdateLevel( pFanout );
//        printf( "Node %6d  Redir fanout %6d from fanin %6d. \n", 
//            Abc_ObjId(pObj), Abc_ObjId(pFanout), Abc_ObjId(pFanin) );
        // update polarity
        if ( pNtk->vPhases && Abc_SclIsInv(pObj) )
            Abc_NodeInvUpdateObjFanoutPolarity( pObj, pFanout );
    }
}